

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<siginfo_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:244:29)>
::getImpl(SimpleTransformPromiseNode<siginfo_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:244:29)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::_::Void> *pEVar1;
  anon_struct_128_5_975a5653_for_value *in;
  Void local_5a9;
  ExceptionOr<kj::_::Void> local_5a8;
  anon_struct_128_5_975a5653_for_value *local_408;
  anon_struct_128_5_975a5653_for_value *depValue;
  anon_struct_128_5_975a5653_for_value *_depValue779;
  Exception *local_258;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_238 [8];
  ExceptionOr<siginfo_t> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<siginfo_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:244:29)>
  *this_local;
  
  depResult.value.ptr.field_1._120_8_ = output;
  ExceptionOr<siginfo_t>::ExceptionOr((ExceptionOr<siginfo_t> *)local_238);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_238);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_238);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<siginfo_t>
                         ((Maybe<siginfo_t> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (anon_struct_128_5_975a5653_for_value *)0x0) {
      local_408 = depValue;
      in = mv<siginfo_t>(depValue);
      MaybeVoidCaller<siginfo_t,kj::_::Void>::
      apply<kj::(anonymous_namespace)::TestCase236::run()::__0>((Type *)&this->field_0x20,in);
      TransformPromiseNodeBase::handle<kj::_::Void>
                (&local_5a8,&this->super_TransformPromiseNodeBase,&local_5a9);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1._120_8_);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_5a8);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_5a8);
    }
  }
  else {
    local_258 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)&_depValue779,false,exception)
    ;
    pEVar1 = ExceptionOrValue::as<kj::_::Void>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1._120_8_);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,(ExceptionOr<kj::_::Void> *)&_depValue779);
    ExceptionOr<kj::_::Void>::~ExceptionOr((ExceptionOr<kj::_::Void> *)&_depValue779);
  }
  ExceptionOr<siginfo_t>::~ExceptionOr((ExceptionOr<siginfo_t> *)local_238);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }